

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t _elemsize;
  Layer *pLVar9;
  void *pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  undefined4 uVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  void *pvVar32;
  ulong uVar33;
  int iVar34;
  int *piVar35;
  int iVar36;
  long lVar37;
  void *pvVar38;
  int iVar39;
  void *pvVar40;
  int remain_3;
  int remain_2;
  int g;
  int channels;
  uint uVar41;
  long lVar42;
  void *pvVar43;
  long lVar44;
  float *pfVar45;
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float local_188;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  
  iVar34 = bottom_blob->c;
  iVar39 = (this->super_ConvolutionDepthWise).group;
  if (iVar34 % iVar39 != 0) {
    return -100;
  }
  if ((this->super_ConvolutionDepthWise).num_output % iVar39 != 0) {
    return -100;
  }
  iVar39 = bottom_blob->w;
  iVar31 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  uVar21 = ((this->super_ConvolutionDepthWise).kernel_w + -1) *
           (this->super_ConvolutionDepthWise).dilation_w;
  uVar22 = ((this->super_ConvolutionDepthWise).kernel_h + -1) *
           (this->super_ConvolutionDepthWise).dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((_elemsize != 1 & (this->super_ConvolutionDepthWise).use_int8_inference) == 1) {
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.elemsize = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount = (int *)0x0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar39,iVar31,iVar34,1,opt->workspace_allocator);
    if ((bottom_blob_int8.data == (void *)0x0) ||
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) {
      Mat::~Mat(&bottom_blob_int8);
      iVar39 = -100;
      goto LAB_00120250;
    }
    iVar36 = (this->super_ConvolutionDepthWise).group;
    channels = iVar34 / iVar36;
    iVar30 = 0;
    for (lVar42 = 0; lVar42 < iVar36; lVar42 = lVar42 + 1) {
      uVar7._0_1_ = opt->lightmode;
      uVar7._1_3_ = *(undefined3 *)&opt->field_0x1;
      uVar7._4_4_ = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g._0_4_ = SUB84(uVar7,0);
      opt_g.num_threads = 1;
      opt_g.blob_allocator = bottom_blob_int8.allocator;
      Mat::channel_range(&bottom_blob_g,bottom_blob,iVar30,channels);
      Mat::channel_range(&bottom_blob_int8_g,&bottom_blob_int8,iVar30,channels);
      pLVar9 = (this->super_ConvolutionDepthWise).quantize_ops.
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar42];
      (*pLVar9->_vptr_Layer[5])(pLVar9,&bottom_blob_g,&bottom_blob_int8_g,&opt_g);
      Mat::~Mat(&bottom_blob_int8_g);
      Mat::~Mat(&bottom_blob_g);
      iVar36 = (this->super_ConvolutionDepthWise).group;
      iVar30 = iVar30 + channels;
    }
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
  }
  bottom_blob_int8_g.data = bottom_blob_unbordered.data;
  bottom_blob_int8_g.refcount = bottom_blob_unbordered.refcount;
  bottom_blob_int8_g.elemsize = bottom_blob_unbordered.elemsize;
  bottom_blob_int8_g.allocator = bottom_blob_unbordered.allocator;
  bottom_blob_int8_g.dims = bottom_blob_unbordered.dims;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  bottom_blob_int8_g.w = bottom_blob_unbordered.w;
  bottom_blob_int8_g.h = bottom_blob_unbordered.h;
  bottom_blob_int8_g.c = bottom_blob_unbordered.c;
  bottom_blob_int8_g.cstep = bottom_blob_unbordered.cstep;
  iVar36 = (this->super_ConvolutionDepthWise).pad_w;
  iVar30 = (this->super_ConvolutionDepthWise).pad_h;
  if (iVar30 < 1 && iVar36 < 1) {
    if (iVar30 == -0xe9 && iVar36 == -0xe9) {
      iVar36 = uVar21 - (iVar39 + -1) % (this->super_ConvolutionDepthWise).stride_w;
      iVar39 = uVar22 - (iVar31 + -1) % (this->super_ConvolutionDepthWise).stride_h;
      if ((0 < iVar36) || (0 < iVar39)) {
        copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8_g,iVar39 / 2,iVar39 - iVar39 / 2,
                         iVar36 / 2,iVar36 - iVar36 / 2,0,0.0,opt->workspace_allocator,
                         opt->num_threads);
        goto LAB_0011f3f1;
      }
      iVar31 = bottom_blob_unbordered.h;
      iVar39 = bottom_blob_unbordered.w;
    }
LAB_0011f47f:
    Mat::create(top_blob,(int)(~uVar21 + iVar39) / (this->super_ConvolutionDepthWise).stride_w + 1,
                (int)(~uVar22 + iVar31) / (this->super_ConvolutionDepthWise).stride_h + 1,
                (this->super_ConvolutionDepthWise).num_output,_elemsize,opt->blob_allocator);
    iVar39 = -100;
    if ((top_blob->data != (void *)0x0) &&
       (uVar21 = top_blob->c, top_blob->cstep * (long)(int)uVar21 != 0)) {
      iVar31 = (this->super_ConvolutionDepthWise).num_output;
      iVar36 = (this->super_ConvolutionDepthWise).group;
      if (iVar36 == iVar31 && iVar34 == iVar36) {
        auVar47._0_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3);
        auVar47._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3);
        auVar47._8_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1);
        auVar47._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_h == 1);
        uVar24 = movmskps(iVar31,auVar47);
        bVar20 = (byte)uVar24;
        bVar20 = bVar20 >> 1 & bVar20 & bVar20 >> 2 & (bVar20 & 8) >> 3;
        if ((this->super_ConvolutionDepthWise).use_int8_inference == true) {
          if (bVar20 == 0) {
LAB_00120182:
            iVar39 = 0;
            for (lVar42 = 0; lVar42 < iVar34; lVar42 = lVar42 + 1) {
              Mat::channel_range(&bottom_blob_int8,&bottom_blob_int8_g,(int)lVar42,1);
              Mat::channel_range(&bottom_blob_g,top_blob,(int)lVar42,1);
              pLVar9 = (this->group_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar42];
              uVar8._0_1_ = opt->lightmode;
              uVar8._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar8._4_4_ = opt->num_threads;
              opt_g.workspace_allocator = opt->workspace_allocator;
              opt_g._0_4_ = SUB84(uVar8,0);
              opt_g.num_threads = 1;
              opt_g.blob_allocator = top_blob->allocator;
              (*pLVar9->_vptr_Layer[5])(pLVar9,&bottom_blob_int8,&bottom_blob_g,&opt_g);
              Mat::~Mat(&bottom_blob_g);
              Mat::~Mat(&bottom_blob_int8);
              iVar34 = (this->super_ConvolutionDepthWise).group;
            }
          }
          else {
            iVar39 = (this->super_ConvolutionDepthWise).stride_w;
            iVar31 = (this->super_ConvolutionDepthWise).stride_h;
            if (iVar31 == 1 && iVar39 == 1) {
              lVar42 = (long)bottom_blob_int8_g.w;
              iVar34 = top_blob->w;
              pvVar10 = (this->super_ConvolutionDepthWise).weight_data.data;
              uVar33 = 0;
              uVar22 = top_blob->h;
              if (top_blob->h < 1) {
                uVar22 = 0;
              }
              if ((int)uVar21 < 1) {
                uVar21 = 0;
              }
              for (; uVar33 != uVar21; uVar33 = uVar33 + 1) {
                Mat::channel(&bottom_blob_int8,top_blob,(int)uVar33);
                Mat::fill(&bottom_blob_int8,0);
                pvVar26 = bottom_blob_int8.data;
                lVar44 = uVar33 * 9;
                pvVar32 = (void *)((long)(int)uVar33 * bottom_blob_int8_g.cstep *
                                   bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
                bottom_blob_g.refcount = (int *)0x0;
                bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
                bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
                bottom_blob_g.dims = 2;
                bottom_blob_g.w = bottom_blob_int8_g.w;
                bottom_blob_g.h = bottom_blob_int8_g.h;
                bottom_blob_g.c = 1;
                bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
                bottom_blob_g.data = pvVar32;
                Mat::~Mat(&bottom_blob_g);
                lVar23 = lVar42 + (long)pvVar32;
                pvVar25 = (void *)(lVar42 * 2 + (long)pvVar32);
                for (uVar41 = 0; uVar41 != uVar22; uVar41 = uVar41 + 1) {
                  lVar37 = 0;
                  pvVar27 = pvVar26;
                  for (iVar39 = iVar34; 0 < iVar39; iVar39 = iVar39 + -1) {
                    *(int *)((long)pvVar26 + lVar37 * 4) =
                         (int)*(char *)((long)pvVar10 + lVar44 + 7) *
                         (int)*(char *)((long)pvVar25 + lVar37 + 1) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 6) *
                         (int)*(char *)((long)pvVar25 + lVar37) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 5) *
                         (int)*(char *)(lVar23 + 2 + lVar37) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 4) *
                         (int)*(char *)(lVar23 + 1 + lVar37) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 3) *
                         (int)*(char *)(lVar23 + lVar37) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 2) *
                         (int)*(char *)((long)pvVar32 + lVar37 + 2) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 1) *
                         (int)*(char *)((long)pvVar32 + lVar37 + 1) +
                         (int)*(char *)((long)pvVar10 + lVar44) *
                         (int)*(char *)((long)pvVar32 + lVar37) +
                         *(int *)((long)pvVar26 + lVar37 * 4) +
                         (int)*(char *)((long)pvVar10 + lVar44 + 8) *
                         (int)*(char *)((long)pvVar25 + lVar37 + 2);
                    pvVar27 = (void *)((long)pvVar27 + 4);
                    lVar37 = lVar37 + 1;
                  }
                  pvVar32 = (void *)((long)pvVar32 + lVar37 + 2);
                  lVar23 = lVar23 + lVar37 + 2;
                  pvVar25 = (void *)((long)pvVar25 + lVar37 + 2);
                  pvVar26 = pvVar27;
                }
                Mat::~Mat(&bottom_blob_int8);
              }
            }
            else {
              if (iVar31 != 2 || iVar39 != 2) goto LAB_00120182;
              lVar42 = (long)bottom_blob_int8_g.w;
              iVar34 = top_blob->w;
              iVar39 = top_blob->h;
              pvVar10 = (this->super_ConvolutionDepthWise).weight_data.data;
              lVar44 = (long)((bottom_blob_int8_g.w - iVar34) * 2);
              uVar33 = 0;
              if (iVar39 < 1) {
                iVar39 = 0;
              }
              uVar29 = (ulong)uVar21;
              if ((int)uVar21 < 1) {
                uVar29 = uVar33;
              }
              for (; uVar33 != uVar29; uVar33 = uVar33 + 1) {
                Mat::channel(&bottom_blob_int8,top_blob,(int)uVar33);
                Mat::fill(&bottom_blob_int8,0);
                piVar35 = (int *)bottom_blob_int8.data;
                lVar23 = uVar33 * 9;
                pvVar25 = (void *)((long)(int)uVar33 * bottom_blob_int8_g.cstep *
                                   bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
                bottom_blob_g.refcount = (int *)0x0;
                bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
                bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
                bottom_blob_g.dims = 2;
                bottom_blob_g.w = bottom_blob_int8_g.w;
                bottom_blob_g.h = bottom_blob_int8_g.h;
                bottom_blob_g.c = 1;
                bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
                bottom_blob_g.data = pvVar25;
                Mat::~Mat(&bottom_blob_g);
                lVar37 = lVar42 + (long)pvVar25;
                pvVar26 = (void *)(lVar42 * 2 + (long)pvVar25);
                for (iVar31 = 0; iVar31 != iVar39; iVar31 = iVar31 + 1) {
                  lVar28 = 0;
                  for (iVar36 = iVar34; 0 < iVar36; iVar36 = iVar36 + -1) {
                    *piVar35 = (int)*(char *)((long)pvVar10 + lVar23 + 7) *
                               (int)*(char *)((long)pvVar26 + lVar28 + 1) +
                               (int)*(char *)((long)pvVar10 + lVar23 + 6) *
                               (int)*(char *)((long)pvVar26 + lVar28) +
                               (int)*(char *)((long)pvVar10 + lVar23 + 5) *
                               (int)*(char *)(lVar37 + 2 + lVar28) +
                               (int)*(char *)((long)pvVar10 + lVar23 + 4) *
                               (int)*(char *)(lVar37 + 1 + lVar28) +
                               (int)*(char *)((long)pvVar10 + lVar23 + 3) *
                               (int)*(char *)(lVar37 + lVar28) +
                               (int)*(char *)((long)pvVar10 + lVar23 + 2) *
                               (int)*(char *)((long)pvVar25 + lVar28 + 2) +
                               (int)*(char *)((long)pvVar10 + lVar23 + 1) *
                               (int)*(char *)((long)pvVar25 + lVar28 + 1) +
                               (int)*(char *)((long)pvVar10 + lVar23) *
                               (int)*(char *)((long)pvVar25 + lVar28) + *piVar35 +
                               (int)*(char *)((long)pvVar10 + lVar23 + 8) *
                               (int)*(char *)((long)pvVar26 + lVar28 + 2);
                    piVar35 = piVar35 + 1;
                    lVar28 = lVar28 + 2;
                  }
                  pvVar25 = (void *)((long)pvVar25 + lVar28 + lVar44);
                  lVar37 = lVar37 + lVar44 + lVar28;
                  pvVar26 = (void *)((long)pvVar26 + lVar28 + lVar44);
                }
                Mat::~Mat(&bottom_blob_int8);
              }
            }
            iVar39 = 0;
            for (lVar42 = 0; lVar42 < (this->super_ConvolutionDepthWise).group; lVar42 = lVar42 + 1)
            {
              uVar19._0_1_ = opt->lightmode;
              uVar19._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar19._4_4_ = opt->num_threads;
              bottom_blob_g.elemsize = (size_t)opt->workspace_allocator;
              bottom_blob_g.data = (void *)CONCAT44(1,(int)uVar19);
              bottom_blob_g.refcount = (int *)top_blob->allocator;
              Mat::channel(&bottom_blob_int8,top_blob,(int)lVar42);
              pLVar9 = (this->super_ConvolutionDepthWise).dequantize_ops.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar42];
              (*pLVar9->_vptr_Layer[7])(pLVar9,&bottom_blob_int8,&bottom_blob_g);
              Mat::~Mat(&bottom_blob_int8);
            }
          }
        }
        else {
          if (bVar20 == 0) goto LAB_00120182;
          iVar39 = (this->super_ConvolutionDepthWise).stride_w;
          iVar31 = (this->super_ConvolutionDepthWise).stride_h;
          if (iVar31 == 1 && iVar39 == 1) {
            lVar42 = (long)bottom_blob_int8_g.w;
            iVar34 = top_blob->w;
            iVar31 = top_blob->h;
            pvVar10 = (this->super_ConvolutionDepthWise).weight_data.data;
            pvVar26 = (this->super_ConvolutionDepthWise).bias_data.data;
            lVar44 = (long)iVar34;
            iVar39 = 0;
            uVar21 = bottom_blob_int8_g.c;
            if (bottom_blob_int8_g.c < 1) {
              uVar21 = 0;
            }
            lVar23 = (long)(bottom_blob_int8_g.w + 2) * 4;
            for (uVar33 = 0; uVar33 != uVar21; uVar33 = uVar33 + 1) {
              Mat::channel(&bottom_blob_int8,top_blob,(int)uVar33);
              pvVar25 = bottom_blob_int8.data;
              if (pvVar26 == (void *)0x0) {
                fVar46 = 0.0;
              }
              else {
                fVar46 = *(float *)((long)pvVar26 + uVar33 * 4);
              }
              lVar37 = uVar33 * 0x24;
              pvVar43 = (void *)((long)(int)uVar33 * bottom_blob_int8_g.cstep *
                                 bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
              bottom_blob_g.refcount = (int *)0x0;
              bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
              bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
              bottom_blob_g.dims = 2;
              bottom_blob_g.w = bottom_blob_int8_g.w;
              bottom_blob_g.h = bottom_blob_int8_g.h;
              bottom_blob_g.c = 1;
              bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
              bottom_blob_g.data = pvVar43;
              Mat::~Mat(&bottom_blob_g);
              pvVar32 = (void *)((long)pvVar43 + lVar42 * 4);
              pvVar27 = (void *)((long)pvVar43 + lVar42 * 8);
              pvVar40 = (void *)((long)pvVar43 + lVar42 * 0xc);
              pvVar38 = pvVar25;
              for (uVar22 = 0; (int)(uVar22 | 1) < iVar31; uVar22 = uVar22 + 2) {
                lVar28 = 0;
                for (iVar36 = iVar34; 0 < iVar36; iVar36 = iVar36 + -1) {
                  uVar7 = *(undefined8 *)((long)pvVar43 + lVar28 + 4);
                  uVar8 = *(undefined8 *)((long)pvVar32 + lVar28 + 4);
                  pfVar45 = (float *)((long)pvVar10 + lVar37);
                  fVar11 = *pfVar45;
                  fVar12 = pfVar45[1];
                  fVar13 = pfVar45[2];
                  fVar14 = pfVar45[3];
                  pfVar45 = (float *)((long)pvVar10 + lVar37 + 0x10);
                  fVar15 = *pfVar45;
                  fVar16 = pfVar45[1];
                  fVar17 = pfVar45[2];
                  fVar18 = pfVar45[3];
                  fVar3 = *(float *)((long)pvVar32 + lVar28);
                  fVar48 = (float)uVar8;
                  fVar49 = (float)((ulong)uVar8 >> 0x20);
                  fVar50 = (float)*(undefined8 *)((long)pvVar27 + lVar28);
                  fVar51 = (float)((ulong)*(undefined8 *)((long)pvVar27 + lVar28) >> 0x20);
                  fVar4 = *(float *)((long)pvVar27 + lVar28 + 8);
                  fVar5 = *(float *)((long)pvVar10 + lVar37 + 0x20);
                  uVar8 = *(undefined8 *)((long)pvVar40 + lVar28);
                  fVar6 = *(float *)((long)pvVar40 + lVar28 + 8);
                  *(float *)((long)pvVar38 + lVar28) =
                       fVar5 * fVar4 + fVar46 +
                       fVar51 * fVar18 + fVar3 * fVar14 + fVar49 * fVar16 + (float)uVar7 * fVar12 +
                       fVar50 * fVar17 + (float)((ulong)uVar7 >> 0x20) * fVar13 +
                       fVar48 * fVar15 + *(float *)((long)pvVar43 + lVar28) * fVar11;
                  *(float *)((long)pvVar25 + lVar28 + lVar44 * 4) =
                       fVar5 * fVar6 + fVar46 +
                       (float)((ulong)uVar8 >> 0x20) * fVar18 + fVar14 * fVar50 +
                       fVar4 * fVar16 + fVar12 * fVar48 +
                       (float)uVar8 * fVar17 + fVar13 * fVar49 + fVar51 * fVar15 + fVar3 * fVar11;
                  lVar28 = lVar28 + 4;
                }
                pvVar43 = (void *)((long)pvVar43 + lVar28 + lVar23);
                pvVar32 = (void *)((long)pvVar32 + lVar28 + lVar23);
                pvVar27 = (void *)((long)pvVar27 + lVar28 + lVar23);
                pvVar40 = (void *)((long)pvVar40 + lVar28 + lVar23);
                pvVar38 = (void *)((long)pvVar38 + lVar28 + lVar44 * 4);
                pvVar25 = (void *)((long)pvVar25 + lVar28 + lVar44 * 4);
              }
              for (; (int)uVar22 < iVar31; uVar22 = uVar22 + 1) {
                lVar28 = 0;
                for (iVar36 = iVar34; 0 < iVar36; iVar36 = iVar36 + -1) {
                  uVar7 = *(undefined8 *)((long)pvVar43 + lVar28 + 4);
                  pfVar45 = (float *)((long)pvVar10 + lVar37);
                  pfVar1 = (float *)((long)pvVar10 + lVar37 + 0x10);
                  uVar8 = *(undefined8 *)((long)pvVar32 + lVar28 + 4);
                  *(float *)((long)pvVar38 + lVar28) =
                       *(float *)((long)pvVar10 + lVar37 + 0x20) *
                       *(float *)((long)pvVar27 + lVar28 + 8) + fVar46 +
                       (float)((ulong)*(undefined8 *)((long)pvVar27 + lVar28) >> 0x20) * pfVar1[3] +
                       *(float *)((long)pvVar32 + lVar28) * pfVar45[3] +
                       (float)((ulong)uVar8 >> 0x20) * pfVar1[1] + (float)uVar7 * pfVar45[1] +
                       (float)*(undefined8 *)((long)pvVar27 + lVar28) * pfVar1[2] +
                       (float)((ulong)uVar7 >> 0x20) * pfVar45[2] +
                       (float)uVar8 * *pfVar1 + *(float *)((long)pvVar43 + lVar28) * *pfVar45;
                  lVar28 = lVar28 + 4;
                }
                pvVar43 = (void *)((long)pvVar43 + lVar28 + 8);
                pvVar32 = (void *)((long)pvVar32 + lVar28 + 8);
                pvVar27 = (void *)((long)pvVar27 + lVar28 + 8);
                pvVar38 = (void *)((long)pvVar38 + lVar28);
              }
              Mat::~Mat(&bottom_blob_int8);
            }
          }
          else {
            if (iVar31 != 2 || iVar39 != 2) goto LAB_00120182;
            lVar42 = (long)bottom_blob_int8_g.w;
            iVar34 = top_blob->w;
            iVar31 = top_blob->h;
            pvVar10 = (this->super_ConvolutionDepthWise).weight_data.data;
            pvVar26 = (this->super_ConvolutionDepthWise).bias_data.data;
            if (iVar31 < 1) {
              iVar31 = 0;
            }
            iVar39 = 0;
            uVar33 = (ulong)(uint)bottom_blob_int8_g.c;
            if (bottom_blob_int8_g.c < 1) {
              uVar33 = 0;
            }
            lVar44 = (long)((bottom_blob_int8_g.w - iVar34) * 2) * 4;
            for (uVar29 = 0; uVar29 != uVar33; uVar29 = uVar29 + 1) {
              Mat::channel(&bottom_blob_int8,top_blob,(int)uVar29);
              pfVar45 = (float *)bottom_blob_int8.data;
              if (pvVar26 == (void *)0x0) {
                local_188 = 0.0;
              }
              else {
                local_188 = *(float *)((long)pvVar26 + uVar29 * 4);
              }
              lVar23 = uVar29 * 0x24;
              pvVar27 = (void *)((long)(int)uVar29 * bottom_blob_int8_g.cstep *
                                 bottom_blob_int8_g.elemsize + (long)bottom_blob_int8_g.data);
              bottom_blob_g.refcount = (int *)0x0;
              bottom_blob_g.elemsize = bottom_blob_int8_g.elemsize;
              bottom_blob_g.allocator = bottom_blob_int8_g.allocator;
              bottom_blob_g.dims = 2;
              bottom_blob_g.w = bottom_blob_int8_g.w;
              bottom_blob_g.h = bottom_blob_int8_g.h;
              bottom_blob_g.c = 1;
              bottom_blob_g.cstep = (size_t)(bottom_blob_int8_g.h * bottom_blob_int8_g.w);
              bottom_blob_g.data = pvVar27;
              Mat::~Mat(&bottom_blob_g);
              pvVar25 = (void *)(lVar42 * 4 + (long)pvVar27);
              pvVar32 = (void *)(lVar42 * 8 + (long)pvVar27);
              for (iVar36 = 0; iVar36 != iVar31; iVar36 = iVar36 + 1) {
                lVar37 = 0;
                for (iVar30 = iVar34; 0 < iVar30; iVar30 = iVar30 + -1) {
                  uVar7 = *(undefined8 *)((long)pvVar27 + lVar37 + 4);
                  pfVar1 = (float *)((long)pvVar10 + lVar23);
                  pfVar2 = (float *)((long)pvVar10 + lVar23 + 0x10);
                  uVar8 = *(undefined8 *)((long)pvVar25 + lVar37 + 4);
                  *pfVar45 = (float)((ulong)*(undefined8 *)((long)pvVar32 + lVar37) >> 0x20) *
                             pfVar2[3] + *(float *)((long)pvVar25 + lVar37) * pfVar1[3] +
                             (float)((ulong)uVar8 >> 0x20) * pfVar2[1] + (float)uVar7 * pfVar1[1] +
                             (float)*(undefined8 *)((long)pvVar32 + lVar37) * pfVar2[2] +
                             (float)((ulong)uVar7 >> 0x20) * pfVar1[2] +
                             (float)uVar8 * *pfVar2 + *(float *)((long)pvVar27 + lVar37) * *pfVar1 +
                             *(float *)((long)pvVar10 + lVar23 + 0x20) *
                             *(float *)((long)pvVar32 + lVar37 + 8) + local_188;
                  pfVar45 = pfVar45 + 1;
                  lVar37 = lVar37 + 8;
                }
                pvVar27 = (void *)((long)pvVar27 + lVar37 + lVar44);
                pvVar25 = (void *)((long)pvVar25 + lVar37 + lVar44);
                pvVar32 = (void *)((long)pvVar32 + lVar37 + lVar44);
              }
              Mat::~Mat(&bottom_blob_int8);
            }
          }
        }
      }
      else {
        iVar34 = iVar34 / iVar36;
        iVar31 = iVar31 / iVar36;
        iVar39 = 0;
        iVar30 = 0;
        local_188 = 0.0;
        for (lVar42 = 0; lVar42 < iVar36; lVar42 = lVar42 + 1) {
          Mat::channel_range(&bottom_blob_int8,&bottom_blob_int8_g,iVar30,iVar34);
          Mat::channel_range(&bottom_blob_g,top_blob,(int)local_188,iVar31);
          pLVar9 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar42];
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.lightmode = opt->lightmode;
          opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_g.num_threads = opt->num_threads;
          opt_g.blob_allocator = top_blob->allocator;
          (*pLVar9->_vptr_Layer[5])(pLVar9,&bottom_blob_int8,&bottom_blob_g,&opt_g);
          Mat::~Mat(&bottom_blob_g);
          Mat::~Mat(&bottom_blob_int8);
          iVar36 = (this->super_ConvolutionDepthWise).group;
          local_188 = (float)((int)local_188 + iVar31);
          iVar30 = iVar30 + iVar34;
        }
      }
    }
  }
  else {
    copy_make_border(&bottom_blob_unbordered,&bottom_blob_int8_g,iVar30,iVar30,iVar36,iVar36,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
LAB_0011f3f1:
    iVar39 = -100;
    if ((bottom_blob_int8_g.data != (void *)0x0) &&
       ((long)bottom_blob_int8_g.c * bottom_blob_int8_g.cstep != 0)) {
      iVar39 = bottom_blob_int8_g.w;
      iVar31 = bottom_blob_int8_g.h;
      goto LAB_0011f47f;
    }
  }
  Mat::~Mat(&bottom_blob_int8_g);
LAB_00120250:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar39;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_inference)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                {
                    if (stride_w == 1 && stride_h == 1)
                    {
                        convdw3x3s1_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }
                    else if (stride_w == 2 && stride_h == 2)
                    {
                        convdw3x3s2_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }

                    // dequantize, reverse scale inplace
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int g=0; g<group; g++)
                    {
                        ncnn::Option opt_g = opt;
                        opt_g.num_threads = 1;
                        opt_g.blob_allocator = top_blob.allocator;

                        Mat top_blob_g = top_blob.channel(g);
                        dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                    }

                    return 0;
                }
            }
        }
        else
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if (stride_w == 1 && stride_h == 1)
                {
                    convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
                else if (stride_w == 2 && stride_h == 2)
                {
                    convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

            // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        ncnn::Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}